

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

string * QStringConverterICU::nul_terminate_impl_abi_cxx11_(QStringView name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  string *result;
  anon_class_8_1_898f2789 convert;
  size_type in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->field_2)._M_allocated_capacity = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&in_RDI->field_2 + 8) = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->_M_dataplus)._M_p = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI->_M_string_length = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  std::__cxx11::string::string(in_RDI);
  QStringView::size(&local_18);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5495f8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(this_00);
  nul_terminate_impl::anon_class_8_1_898f2789::operator()
            ((anon_class_8_1_898f2789 *)this_00,(char *)in_RDI,in_stack_ffffffffffffffa8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (this,in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static std::string nul_terminate_impl(QStringView name)
    {
        std::string result;
        const auto convert = [&](char *p, size_t n) {
                const auto sz = QLatin1::convertFromUnicode(p, name) - p;
                Q_ASSERT(q20::cmp_less_equal(sz, n));
                return sz;
            };
#ifdef __cpp_lib_string_resize_and_overwrite
        result.resize_and_overwrite(size_t(name.size()), convert);
#else
        result.resize(size_t(name.size()));
        result.resize(convert(result.data(), result.size()));
#endif // __cpp_lib_string_resize_and_overwrite
        return result;
    }